

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

float32 likelhddec(float32 *meana,float32 *vara,float32 *meanb,float32 *varb,float32 **cnta,
                  float32 **cntb,int32 ndensity,int32 nfeat,int32 dim,int32 continuous)

{
  double dVar1;
  double __x;
  undefined1 auVar2 [16];
  cmd_ln_t *cmdln;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float32 fVar13;
  float32 fVar14;
  float fVar15;
  double dVar16;
  double dVar17;
  undefined1 local_48 [24];
  
  if (continuous == 0) {
    uVar3 = 0;
    uVar5 = (ulong)(uint)ndensity;
    if (ndensity < 1) {
      uVar5 = uVar3;
    }
    uVar6 = (ulong)(uint)nfeat;
    if (nfeat < 1) {
      uVar6 = uVar3;
    }
    fVar13 = 0.0;
    for (; uVar3 != uVar6; uVar3 = uVar3 + 1) {
      auVar2._12_4_ = 0;
      auVar2._0_12_ = local_48._4_12_;
      local_48._0_16_ = auVar2 << 0x20;
      uVar4 = 0;
      fVar7 = 0.0;
      while( true ) {
        if (uVar5 == uVar4) break;
        fVar12 = (float)cnta[uVar3][uVar4];
        fVar8 = (float)cntb[uVar3][uVar4];
        dVar16 = 0.0;
        if ((fVar12 != 0.0) || (fVar14 = (float32)fVar8, NAN(fVar12))) {
          dVar16 = log((double)fVar12);
          dVar16 = dVar16 * (double)fVar12;
          fVar14 = cntb[uVar3][uVar4];
        }
        dVar17 = 0.0;
        if (((float)fVar14 != 0.0) || (NAN((float)fVar14))) {
          dVar17 = log((double)(float)fVar14);
          dVar17 = dVar17 * (double)(float)fVar14;
          fVar14 = cntb[uVar3][uVar4];
        }
        fVar10 = (float)fVar14 + (float)cnta[uVar3][uVar4];
        dVar1 = 0.0;
        if ((fVar10 != 0.0) || (NAN(fVar10))) {
          dVar1 = log((double)fVar10);
          dVar1 = dVar1 * (double)fVar10;
        }
        local_48._0_4_ = (float)local_48._0_4_ + fVar12;
        fVar7 = fVar7 + fVar8;
        fVar13 = (float32)(float)((double)(float)fVar13 + ((dVar16 + dVar17) - dVar1));
        uVar4 = uVar4 + 1;
      }
      dVar16 = 0.0;
      if (((float)local_48._0_4_ != 0.0) || (NAN((float)local_48._0_4_))) {
        dVar16 = log((double)(float)local_48._0_4_);
        dVar16 = dVar16 * (double)(float)local_48._0_4_;
      }
      dVar17 = 0.0;
      if ((fVar7 != 0.0) || (NAN(fVar7))) {
        dVar17 = log((double)fVar7);
        dVar17 = dVar17 * (double)fVar7;
      }
      fVar7 = (float)local_48._0_4_ + fVar7;
      dVar1 = 0.0;
      if ((fVar7 != 0.0) || (NAN(fVar7))) {
        __x = (double)fVar7;
        local_48._0_8_ = __x;
        dVar1 = log(__x);
        dVar1 = dVar1 * __x;
      }
      fVar13 = (float32)(float)((double)(float)fVar13 - ((dVar16 + dVar17) - dVar1));
    }
  }
  else {
    cmdln = cmd_ln_get();
    dVar16 = cmd_ln_float_r(cmdln,"-varfloor");
    fVar7 = (float)**cnta + (float)**cntb;
    uVar3 = 0;
    uVar5 = (ulong)(uint)dim;
    if (dim < 1) {
      uVar5 = uVar3;
    }
    fVar8 = 0.0;
    fVar10 = 0.0;
    fVar12 = 0.0;
    for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      fVar11 = (float)meana[uVar3];
      fVar9 = (float)meanb[uVar3];
      fVar15 = ((float)**cnta * fVar11 + (float)**cntb * fVar9) / fVar7;
      fVar9 = ((fVar11 * fVar11 + (float)vara[uVar3]) * (float)**cnta +
              (fVar9 * fVar9 + (float)varb[uVar3]) * (float)**cntb) / fVar7 - fVar15 * fVar15;
      fVar11 = (float)dVar16;
      if ((float)dVar16 <= fVar9) {
        fVar11 = fVar9;
      }
      dVar17 = log((double)fVar11);
      dVar1 = log((double)(float)varb[uVar3]);
      fVar12 = fVar12 + (float)dVar1;
      dVar1 = log((double)(float)vara[uVar3]);
      fVar8 = fVar8 + (float)dVar17;
      fVar10 = fVar10 + (float)dVar1;
    }
    fVar13 = (float32)(((fVar7 * fVar8 - fVar12 * (float)**cntb) - fVar10 * (float)**cnta) * 0.5);
  }
  return fVar13;
}

Assistant:

float32    likelhddec(float32 *meana, float32 *vara,
                      float32 *meanb, float32 *varb,
                      float32 **cnta, float32 **cntb,
                      int32 ndensity, int32 nfeat, int32 dim, int32 continuous)
{
    int32   i;
    float32 cntc, la, lb, lc, nm, nv, lkdec, minvar;

    if (continuous) {
        minvar = cmd_ln_float32("-varfloor");
        cntc = cnta[0][0] + cntb[0][0];

        for (i=0, lc=0, lb=0, la=0;i<dim;i++){
            nm = (cnta[0][0]*meana[i] + cntb[0][0]*meanb[i])/cntc;
            nv = cnta[0][0]*(vara[i]+meana[i]*meana[i])+
                 cntb[0][0]*(varb[i]+meanb[i]*meanb[i]);
            nv = nv/cntc - nm*nm;
            if (nv < minvar) nv = minvar;
            lc += (float32)log(nv);
            lb += (float32)log(varb[i]);
            la += (float32)log(vara[i]);
        }
        lkdec = 0.5*(cntc*lc - cntb[0][0]*lb - cnta[0][0]*la);
    }
    else {
        int32 j;
        float32 P,Q;
        for (i=0,lkdec = 0; i < nfeat; i++) {
            for (j=0,P=0,Q=0; j < ndensity; j++) {
                P += cnta[i][j]; Q += cntb[i][j];
                lkdec += ((cnta[i][j]==0) ? 0 : cnta[i][j]*log(cnta[i][j]))
		       + ((cntb[i][j]==0) ? 0 : cntb[i][j]*log(cntb[i][j]))
		       - (((cnta[i][j]+cntb[i][j])==0) ? 0 : 
			  (cnta[i][j]+cntb[i][j])*log(cnta[i][j]+cntb[i][j]));
            }
            lkdec -= 
		((P==0) ? 0 : (P*log(P))) +
		((Q==0) ? 0 : (Q*log(Q))) -
		(((P+Q)==0) ? 0 : ((P+Q)*log(P+Q)));
        }
#if 0
        /* The old code, assumed log(0) would give a reasonable answer */
	for (i=0,lkdec = 0; i < nfeat; i++) {
            for (j=0,P=0,Q=0; j < ndensity; j++) {
                P += cnta[i][j]; Q += cntb[i][j];
                lkdec += cnta[i][j]*log(cnta[i][j]) + cntb[i][j]*log(cntb[i][j])
                           -(cnta[i][j]+cntb[i][j])*log(cnta[i][j]+cntb[i][j]);
            }
            lkdec -= P*log(P) + Q*log(Q) - (P+Q)*log(P+Q);
        }
#endif 
    }

    return(lkdec);
}